

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O2

int libssh2_agent_connect(LIBSSH2_AGENT *agent)

{
  agent_ops *paVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = -1;
  lVar3 = 0;
  do {
    if (lVar3 + 0x10 == 0x20) {
      return iVar2;
    }
    paVar1 = *(agent_ops **)((long)&supported_backends[0].ops + lVar3);
    agent->ops = paVar1;
    iVar2 = (*paVar1->connect)(agent);
    lVar3 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_agent_connect(LIBSSH2_AGENT *agent)
{
    int i, rc = -1;
    for(i = 0; supported_backends[i].name; i++) {
        agent->ops = supported_backends[i].ops;
        rc = (agent->ops->connect)(agent);
        if(!rc)
            return 0;
    }
    return rc;
}